

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

void __thiscall double_conversion::Bignum::BigitsShiftLeft(Bignum *this,int shift_amount)

{
  ushort uVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  
  uVar1 = this->used_bigits_;
  if (0 < (long)(short)uVar1) {
    lVar6 = 0;
    uVar4 = 0;
    do {
      uVar2 = this->bigits_buffer_[lVar6];
      bVar3 = 0x1c - (byte)shift_amount & 0x1f;
      uVar5 = uVar2 >> bVar3;
      this->bigits_buffer_[lVar6] = (uVar2 << ((byte)shift_amount & 0x1f)) + uVar4 & 0xfffffff;
      lVar6 = lVar6 + 1;
      uVar4 = uVar5;
    } while ((short)uVar1 != lVar6);
    if (uVar2 >> bVar3 != 0) {
      this->bigits_buffer_[uVar1] = uVar5;
      this->used_bigits_ = uVar1 + 1;
    }
  }
  return;
}

Assistant:

void Bignum::BigitsShiftLeft(const int shift_amount) {
  DOUBLE_CONVERSION_ASSERT(shift_amount < kBigitSize);
  DOUBLE_CONVERSION_ASSERT(shift_amount >= 0);
  Chunk carry = 0;
  for (int i = 0; i < used_bigits_; ++i) {
    const Chunk new_carry = RawBigit(i) >> (kBigitSize - shift_amount);
    RawBigit(i) = ((RawBigit(i) << shift_amount) + carry) & kBigitMask;
    carry = new_carry;
  }
  if (carry != 0) {
    RawBigit(used_bigits_) = carry;
    used_bigits_++;
  }
}